

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_12::PathVerifier::VerifyPolicyMappings
          (PathVerifier *this,ParsedCertificate *cert,CertErrors *errors)

{
  Input lhs;
  Input lhs_00;
  bool bVar1;
  vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_> *pvVar2;
  reference pPVar3;
  ParsedPolicyMapping *mapping_2;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_> *__range3_1;
  ParsedPolicyMapping *mapping_1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_> *__range3;
  Span<const_unsigned_char> local_90;
  uchar *local_80;
  size_t local_78;
  Span<const_unsigned_char> local_70;
  Span<const_unsigned_char> local_60;
  uchar *local_50;
  size_t local_48;
  reference local_40;
  ParsedPolicyMapping *mapping;
  const_iterator __end2;
  const_iterator __begin2;
  vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_> *__range2;
  CertErrors *errors_local;
  ParsedCertificate *cert_local;
  PathVerifier *this_local;
  
  bVar1 = ParsedCertificate::has_policy_mappings(cert);
  if (bVar1) {
    pvVar2 = ParsedCertificate::policy_mappings(cert);
    __end2 = ::std::vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>::
             begin(pvVar2);
    mapping = (ParsedPolicyMapping *)
              ::std::vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>::
              end(pvVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_bssl::ParsedPolicyMapping_*,_std::vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>_>
                                       *)&mapping), bVar1) {
      local_40 = __gnu_cxx::
                 __normal_iterator<const_bssl::ParsedPolicyMapping_*,_std::vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>_>
                 ::operator*(&__end2);
      local_50 = (local_40->issuer_domain_policy).data_.data_;
      local_48 = (local_40->issuer_domain_policy).data_.size_;
      Span<unsigned_char_const>::Span<4ul>
                ((Span<unsigned_char_const> *)&local_70,(uchar (*) [4])&kAnyPolicyOid);
      bssl::der::Input::Input((Input *)&local_60,local_70);
      lhs_00.data_.size_ = local_48;
      lhs_00.data_.data_ = local_50;
      bVar1 = bssl::der::operator==(lhs_00,(Input)local_60);
      if (bVar1) {
LAB_006184ca:
        ValidPolicyGraph::SetNull(&this->valid_policy_graph_);
        CertErrors::AddError(errors,"PolicyMappings must not map anyPolicy");
        return;
      }
      local_80 = (local_40->subject_domain_policy).data_.data_;
      local_78 = (local_40->subject_domain_policy).data_.size_;
      Span<unsigned_char_const>::Span<4ul>
                ((Span<unsigned_char_const> *)&__range3,(uchar (*) [4])&kAnyPolicyOid);
      bssl::der::Input::Input((Input *)&local_90,___range3);
      lhs.data_.size_ = local_78;
      lhs.data_.data_ = local_80;
      bVar1 = bssl::der::operator==(lhs,(Input)local_90);
      if (bVar1) goto LAB_006184ca;
      __gnu_cxx::
      __normal_iterator<const_bssl::ParsedPolicyMapping_*,_std::vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>_>
      ::operator++(&__end2);
    }
    if (this->policy_mapping_ != 0) {
      pvVar2 = ParsedCertificate::policy_mappings(cert);
      __end3 = ::std::vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
               ::begin(pvVar2);
      mapping_1 = (ParsedPolicyMapping *)
                  ::std::
                  vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>::end
                            (pvVar2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_bssl::ParsedPolicyMapping_*,_std::vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>_>
                                         *)&mapping_1), bVar1) {
        pPVar3 = __gnu_cxx::
                 __normal_iterator<const_bssl::ParsedPolicyMapping_*,_std::vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>_>
                 ::operator*(&__end3);
        ValidPolicyGraph::AddPolicyMapping
                  (&this->valid_policy_graph_,(Input)(pPVar3->issuer_domain_policy).data_,
                   (Input)(pPVar3->subject_domain_policy).data_);
        __gnu_cxx::
        __normal_iterator<const_bssl::ParsedPolicyMapping_*,_std::vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>_>
        ::operator++(&__end3);
      }
    }
    if (this->policy_mapping_ == 0) {
      pvVar2 = ParsedCertificate::policy_mappings(cert);
      __end3_1 = ::std::
                 vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>::
                 begin(pvVar2);
      mapping_2 = (ParsedPolicyMapping *)
                  ::std::
                  vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>::end
                            (pvVar2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<const_bssl::ParsedPolicyMapping_*,_std::vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>_>
                                 *)&mapping_2), bVar1) {
        pPVar3 = __gnu_cxx::
                 __normal_iterator<const_bssl::ParsedPolicyMapping_*,_std::vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>_>
                 ::operator*(&__end3_1);
        ValidPolicyGraph::DeleteNode
                  (&this->valid_policy_graph_,(Input)(pPVar3->issuer_domain_policy).data_);
        __gnu_cxx::
        __normal_iterator<const_bssl::ParsedPolicyMapping_*,_std::vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>_>
        ::operator++(&__end3_1);
      }
    }
  }
  return;
}

Assistant:

void PathVerifier::VerifyPolicyMappings(const ParsedCertificate &cert,
                                        CertErrors *errors) {
  if (!cert.has_policy_mappings()) {
    return;
  }

  // From RFC 5280 section 6.1.4:
  //
  //  (a)  If a policy mappings extension is present, verify that the
  //       special value anyPolicy does not appear as an
  //       issuerDomainPolicy or a subjectDomainPolicy.
  for (const ParsedPolicyMapping &mapping : cert.policy_mappings()) {
    if (mapping.issuer_domain_policy == der::Input(kAnyPolicyOid) ||
        mapping.subject_domain_policy == der::Input(kAnyPolicyOid)) {
      // Because this implementation continues processing certificates after
      // this error, clear the valid policy graph to ensure the
      // "user_constrained_policy_set" output upon failure is empty.
      valid_policy_graph_.SetNull();
      errors->AddError(cert_errors::kPolicyMappingAnyPolicy);
      return;
    }
  }

  //  (b)  If a policy mappings extension is present, then for each
  //       issuerDomainPolicy ID-P in the policy mappings extension:
  //
  //     (1)  If the policy_mapping variable is greater than 0, for each
  //          node in the valid_policy_tree of depth i where ID-P is the
  //          valid_policy, set expected_policy_set to the set of
  //          subjectDomainPolicy values that are specified as
  //          equivalent to ID-P by the policy mappings extension.
  //
  //          If no node of depth i in the valid_policy_tree has a
  //          valid_policy of ID-P but there is a node of depth i with a
  //          valid_policy of anyPolicy, then generate a child node of
  //          the node of depth i-1 that has a valid_policy of anyPolicy
  //          as follows:
  //
  //        (i)    set the valid_policy to ID-P;
  //
  //        (ii)   set the qualifier_set to the qualifier set of the
  //               policy anyPolicy in the certificate policies
  //               extension of certificate i; and
  //
  //        (iii)  set the expected_policy_set to the set of
  //               subjectDomainPolicy values that are specified as
  //               equivalent to ID-P by the policy mappings extension.
  //
  if (policy_mapping_ > 0) {
    for (const ParsedPolicyMapping &mapping : cert.policy_mappings()) {
      valid_policy_graph_.AddPolicyMapping(mapping.issuer_domain_policy,
                                           mapping.subject_domain_policy);
    }
  }

  //  (b)  If a policy mappings extension is present, then for each
  //       issuerDomainPolicy ID-P in the policy mappings extension:
  //
  //  ...
  //
  //     (2)  If the policy_mapping variable is equal to 0:
  //
  //        (i)    delete each node of depth i in the valid_policy_tree
  //               where ID-P is the valid_policy.
  //
  //        (ii)   If there is a node in the valid_policy_tree of depth
  //               i-1 or less without any child nodes, delete that
  //               node.  Repeat this step until there are no nodes of
  //               depth i-1 or less without children.
  //
  // Step (ii) is deferred to part of GetUserConstrainedPolicySet().
  if (policy_mapping_ == 0) {
    for (const ParsedPolicyMapping &mapping : cert.policy_mappings()) {
      valid_policy_graph_.DeleteNode(mapping.issuer_domain_policy);
    }
  }
}